

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# virtmem.cpp
# Opt level: O2

Error asmjit::_abi_1_10::VirtMem::asmjitErrorFromErrno(int e)

{
  if ((uint)e < 0x1c) {
    if ((0x82802U >> (e & 0x1fU) & 1) != 0) {
      return 3;
    }
    if ((0x1800000U >> (e & 0x1fU) & 1) != 0) {
      return 8;
    }
    if ((0x8001000U >> (e & 0x1fU) & 1) != 0) {
      return 1;
    }
  }
  if (e == 0x4b) {
    return 1;
  }
  return 2;
}

Assistant:

static Error asmjitErrorFromErrno(int e) noexcept {
  switch (e) {
    case EACCES:
    case EAGAIN:
    case ENODEV:
    case EPERM:
      return kErrorInvalidState;

    case EFBIG:
    case ENOMEM:
    case EOVERFLOW:
      return kErrorOutOfMemory;

    case EMFILE:
    case ENFILE:
      return kErrorTooManyHandles;

    default:
      return kErrorInvalidArgument;
  }
}